

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

void __thiscall
Parser::FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
          (Parser *this,ParseNodePtr pnodeScopeList,anon_class_16_2_9bc0f637 fn)

{
  Scanner_t *this_00;
  OpCode OVar1;
  LocalFunctionId funcId;
  Scope *pSVar2;
  Scope *pSVar3;
  ParseNodeFnc *pPVar4;
  ParseNodeVar *pPVar5;
  ParseNodePtr *ppPVar6;
  ParseNode *this_01;
  Symbol *pSVar7;
  code *pcVar8;
  anon_class_32_4_34db34f2 handler;
  anon_class_32_4_34db34f2 handler_00;
  uint scopeId;
  undefined4 *puVar9;
  bool bVar10;
  ParseNodeBlock *pPVar11;
  ParseNodeCatch *pPVar12;
  PidRefStack *pPVar13;
  ParseNodeWith *pPVar14;
  ParseNodeFnc *pPVar15;
  ParseNodePtr pPVar16;
  ParseNodeParamPattern *pPVar17;
  ParseNodeBlock *pnodeBlock;
  ParseNodeFnc *pPVar18;
  ParseNodePtr *ppPVar19;
  ParseContext *pPVar20;
  Parser *this_02;
  Parser *this_03;
  Symbol *pSVar21;
  anon_class_32_4_34db34f2 local_98;
  ParseNodeVar *local_78;
  ParseNodeBlock *local_70;
  ParseNodeVar *local_68;
  Scope *local_60;
  Scope *scope;
  LocalFunctionId local_4c;
  ParseNodeFnc *local_48;
  uint local_3c;
  undefined4 *puStack_38;
  uint blockId;
  
  pPVar20 = fn.parseContext;
  this_02 = fn.this;
  pSVar2 = this->m_currentScope;
  puStack_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  this_00 = &this_02->m_scan;
  scope = (Scope *)this;
  do {
    if (pnodeScopeList == (ParseNode *)0x0) {
      return;
    }
    OVar1 = pnodeScopeList->nop;
    if (OVar1 == knopFncDecl) {
      local_48 = ParseNode::AsParseNodeFnc(pnodeScopeList);
      if ((local_48->super_ParseNode).nop != knopFncDecl) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = puStack_38;
        *puStack_38 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                            ,0x2d6a,"(pnodeFnc->nop == knopFncDecl)","pnodeFnc->nop == knopFncDecl")
        ;
        if (!bVar10) goto LAB_00ceba17;
        *puVar9 = 0;
      }
      Scanner<UTF8EncodingPolicyBase<false>_>::Clear(this_00);
      pPVar18 = local_48;
      Scanner<UTF8EncodingPolicyBase<false>_>::SetText
                (this_00,pPVar20->pszSrc,local_48->cbMin,local_48->cbLim - local_48->cbMin,
                 (local_48->super_ParseNode).ichMin,pPVar20->isUtf8,pPVar20->grfscr,
                 local_48->lineNumber);
      Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
      if ((pPVar18->pnodeBody == (ParseNodePtr)0x0) &&
         ((pPVar18->fncFlags & kFunctionHasNonSimpleParameterList) == kFunctionNone)) {
        pPVar4 = this_02->m_currentNodeFunc;
        this_02->m_currentNodeFunc = pPVar18;
        pPVar5 = pPVar18->pnodeName;
        if (pPVar5 == (ParseNodeVar *)0x0) {
          local_70 = (ParseNodeBlock *)0x0;
          pPVar18 = local_48;
        }
        else {
          if ((pPVar5->super_ParseNode).nop != knopVarDecl) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = puStack_38;
            *puStack_38 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                ,0x2d84,"(pnodeName->nop == knopVarDecl)",
                                "pnodeName->nop == knopVarDecl");
            if (!bVar10) goto LAB_00ceba17;
            *puVar9 = 0;
          }
          local_78 = ParseNode::AsParseNodeVar(&pPVar5->super_ParseNode);
          pPVar18 = local_48;
          if (local_78->pnodeNext != (ParseNodePtr)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = puStack_38;
            *puStack_38 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                ,0x2d86,"(pnodeVarName->pnodeNext == nullptr)",
                                "pnodeVarName->pnodeNext == nullptr");
            if (!bVar10) goto LAB_00ceba17;
            *puVar9 = 0;
          }
          if ((pPVar18->fncFlags & kFunctionDeclaration) == kFunctionNone) {
            pPVar11 = StartParseBlock<true>(this_02,Function,ScopeType_FuncExpr,(LabelId *)0x0);
            pPVar5 = local_78;
            pPVar13 = PushPidRef(this_02,local_78->pid);
            pPVar5->symRef = &pPVar13->sym;
            pSVar21 = pPVar5->sym;
            pPVar13->sym = pSVar21;
            pSVar3 = pPVar11->scope;
            local_70 = pPVar11;
            Scope::AddNewSymbol(pSVar3,pSVar21);
            pPVar18->scope = pSVar3;
          }
          else {
            local_70 = (ParseNodeBlock *)0x0;
          }
        }
        pPVar11 = StartParseBlock<true>(this_02,Parameter,ScopeType_Parameter,(LabelId *)0x0);
        pPVar18->pnodeScopes = pPVar11;
        this_02->m_ppnodeScope = &pPVar11->pnodeScopes;
        pPVar11->pnodeStmt = &pPVar18->super_ParseNode;
        ppPVar19 = &pPVar18->pnodeVars;
        if (((pPVar18->fncFlags & (kFunctionIsLambda|kFunctionIsModule)) == kFunctionNone) &&
           (((pPVar18->super_ParseNode).grfpn & 2) == 0)) {
          ppPVar6 = this_02->m_ppnodeVar;
          this_02->m_ppnodeVar = ppPVar19;
          local_68 = AddArgumentsNodeToVars(this_02,pPVar18);
          ppPVar19 = this_02->m_ppnodeVar;
          this_02->m_ppnodeVar = ppPVar6;
        }
        else {
          local_68 = (ParseNodeVar *)0x0;
        }
        local_60 = pPVar11->scope;
        local_3c = this_02->m_currentBlockInfo->pnodeBlock->blockId;
        pPVar15 = GetCurrentFunctionNode(this_02);
        local_4c = pPVar15->functionId;
        local_98.blockId = &local_3c;
        local_98.funcId = &local_4c;
        local_98.scope = &local_60;
        local_98.this = this_02;
        for (pPVar16 = pPVar18->pnodeParams; pPVar16 != (ParseNode *)0x0;
            pPVar16 = ParseNode::GetFormalNext(pPVar16)) {
          FinishDeferredFunction::anon_class_16_2_9bc0f637::operator()::anon_class_32_4_34db34f2::
          operator()(&local_98,pPVar16);
        }
        if (pPVar18->pnodeRest != (ParseNodePtr)0x0) {
          FinishDeferredFunction::anon_class_16_2_9bc0f637::operator()::anon_class_32_4_34db34f2::
          operator()(&local_98,pPVar18->pnodeRest);
        }
        local_98.blockId = &local_3c;
        local_98.funcId = &local_4c;
        local_98.scope = &local_60;
        local_98.this = this_02;
        for (pPVar16 = pPVar18->pnodeParams; pPVar16 != (ParseNode *)0x0;
            pPVar16 = ParseNode::GetFormalNext(pPVar16)) {
          if (pPVar16->nop == knopParamPattern) {
            pPVar17 = ParseNode::AsParseNodeParamPattern(pPVar16);
            handler.blockId._0_4_ = (int)local_98.blockId;
            handler.this = local_98.this;
            handler.blockId._4_4_ = (int)((ulong)local_98.blockId >> 0x20);
            handler.funcId = local_98.funcId;
            handler.scope = local_98.scope;
            operator()((pPVar17->super_ParseNodeUni).pnode1,handler);
          }
        }
        this_01 = pPVar18->pnodeRest;
        if ((this_01 != (ParseNode *)0x0) && (this_01->nop == knopParamPattern)) {
          pPVar17 = ParseNode::AsParseNodeParamPattern(this_01);
          handler_00.blockId._0_4_ = (int)local_98.blockId;
          handler_00.this = local_98.this;
          handler_00.blockId._4_4_ = (int)((ulong)local_98.blockId >> 0x20);
          handler_00.funcId = local_98.funcId;
          handler_00.scope = local_98.scope;
          operator()((pPVar17->super_ParseNodeUni).pnode1,handler_00);
        }
        pnodeBlock = StartParseBlock<true>(this_02,Function,ScopeType_FunctionBody,(LabelId *)0x0);
        pPVar18->pnodeBodyScope = pnodeBlock;
        *this_02->m_ppnodeScope = (ParseNodePtr)pnodeBlock;
        ppPVar6 = this_02->m_ppnodeScope;
        this_02->m_ppnodeScope = &pnodeBlock->pnodeScopes;
        pnodeBlock->pnodeStmt = &pPVar18->super_ParseNode;
        pPVar5 = (ParseNodeVar *)this_02->m_ppnodeExprScope;
        this_02->m_ppnodeExprScope = (ParseNodePtr *)0x0;
        if (*this_02->m_ppnodeVar != (ParseNodePtr)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = puStack_38;
          *puStack_38 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                              ,0x2dda,"(*m_ppnodeVar == nullptr)","*m_ppnodeVar == nullptr");
          if (!bVar10) goto LAB_00ceba17;
          *puVar9 = 0;
        }
        this_02->m_ppnodeVar = ppPVar19;
        local_78 = pPVar5;
        if (local_60 != (Scope *)0x0) {
          if (local_48->isBodyAndParamScopeMerged == false) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = puStack_38;
            *puStack_38 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                ,0x2de1,"(pnodeFnc->IsBodyAndParamScopeMerged())",
                                "pnodeFnc->IsBodyAndParamScopeMerged()");
            if (!bVar10) goto LAB_00ceba17;
            *puVar9 = 0;
          }
          local_3c = this_02->m_currentBlockInfo->pnodeBlock->blockId;
          pPVar18 = GetCurrentFunctionNode(this_02);
          scopeId = local_3c;
          funcId = pPVar18->functionId;
          pSVar21 = local_60->m_symList;
          local_4c = funcId;
          while (pSVar21 != (Symbol *)0x0) {
            pSVar7 = pSVar21->next;
            pPVar13 = FindOrAddPidRef(this_02,pSVar21->pid,scopeId,funcId);
            pPVar13->sym = pSVar21;
            pSVar21 = pSVar7;
          }
        }
        puVar9 = puStack_38;
        this = (Parser *)scope;
        if (this_02->m_currentNodeNonLambdaFunc != (ParseNodeFnc *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                              ,0x2deb,"(m_currentNodeNonLambdaFunc == nullptr)",
                              "m_currentNodeNonLambdaFunc == nullptr");
          if (!bVar10) goto LAB_00ceba17;
          *puVar9 = 0;
        }
        pPVar18 = local_48;
        this_02->m_currentNodeNonLambdaFunc = local_48;
        FinishFncNode(this_02,local_48,true);
        if (this_02->m_currentNodeNonLambdaFunc != pPVar18) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = puStack_38;
          *puStack_38 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                              ,0x2df0,"(pnodeFnc == m_currentNodeNonLambdaFunc)",
                              "pnodeFnc == m_currentNodeNonLambdaFunc");
          if (!bVar10) goto LAB_00ceba17;
          *puVar9 = 0;
          pPVar18 = local_48;
        }
        this_02->m_currentNodeNonLambdaFunc = (ParseNodeFnc *)0x0;
        this_02->m_ppnodeExprScope = (ParseNodePtr *)local_78;
        ppPVar19 = this_02->m_ppnodeScope;
        if (ppPVar19 == (ParseNodePtr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = puStack_38;
          *puStack_38 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                              ,0x2df5,"(m_ppnodeScope)","m_ppnodeScope");
          if (!bVar10) goto LAB_00ceba17;
          *puVar9 = 0;
          ppPVar19 = this_02->m_ppnodeScope;
          pPVar18 = local_48;
        }
        if (*ppPVar19 != (ParseNodePtr)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = puStack_38;
          *puStack_38 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                              ,0x2df6,"(nullptr == *m_ppnodeScope)","nullptr == *m_ppnodeScope");
          if (!bVar10) {
LAB_00ceba17:
            pcVar8 = (code *)invalidInstructionException();
            (*pcVar8)();
          }
          *puVar9 = 0;
          pPVar18 = local_48;
        }
        this_02->m_ppnodeScope = ppPVar6;
        this_03 = this_02;
        FinishParseBlock(this_02,pnodeBlock,true);
        if (((pPVar18->fncFlags >> 10 & 1) == 0) &&
           (((pPVar18->fncFlags >> 0xd & 1) == 0 || ((this_02->m_token).tk == tkLCurly)))) {
          UpdateArgumentsNode(this_03,pPVar18,local_68);
        }
        CreateSpecialSymbolDeclarations(this_02,pPVar18);
        FinishParseBlock(this_02,pPVar11,true);
        if (local_70 != (ParseNodeBlock *)0x0) {
          FinishParseBlock(this_02,local_70,true);
        }
        this_02->m_currentNodeFunc = pPVar4;
      }
      pPVar18 = ParseNode::AsParseNodeFnc(pnodeScopeList);
      ppPVar19 = &pPVar18->pnodeNext;
    }
    else if (OVar1 == knopCatch) {
      pPVar12 = ParseNode::AsParseNodeCatch(pnodeScopeList);
      this = (Parser *)scope;
      pSVar3 = pPVar12->scope;
      if (pSVar3 == (Scope *)0x0) {
        pPVar11 = CreateBlockNode((Parser *)scope,Regular);
        pPVar11->scope = (Scope *)0x0;
        PushBlockInfo(this,pPVar11);
        pPVar12 = ParseNode::AsParseNodeCatch(pnodeScopeList);
        FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                  (this,pPVar12->pnodeScopes,fn);
      }
      else {
        PushScope((Parser *)scope,pSVar3);
        pPVar11 = CreateBlockNode(this,Regular);
        pPVar11->scope = pSVar3;
        PushBlockInfo(this,pPVar11);
        pPVar12 = ParseNode::AsParseNodeCatch(pnodeScopeList);
        FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                  (this,pPVar12->pnodeScopes,fn);
        BindPidRefs<false>(this,*(BlockInfoStack **)&((Scope *)((long)this + 0xa20))->scopeType,
                           *(int *)((long)&((Scope *)((long)this + 0x90))->func + 4) - 1);
        PopScope(this,pSVar3);
      }
      PopBlockInfo(this);
      pPVar12 = ParseNode::AsParseNodeCatch(pnodeScopeList);
      ppPVar19 = &pPVar12->pnodeNext;
    }
    else if (OVar1 == knopWith) {
      pPVar11 = CreateBlockNode(this,Regular);
      PushBlockInfo(this,pPVar11);
      PushDynamicBlock(this);
      pPVar14 = ParseNode::AsParseNodeWith(pnodeScopeList);
      FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                (this,pPVar14->pnodeScopes,fn);
      PopBlockInfo(this);
      pPVar14 = ParseNode::AsParseNodeWith(pnodeScopeList);
      ppPVar19 = &pPVar14->pnodeNext;
    }
    else {
      if (OVar1 != knopBlock) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = puStack_38;
        *puStack_38 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                            ,0x2d40,"(false)","Unexpected node with scope list");
        if (bVar10) {
          *puVar9 = 0;
          return;
        }
        goto LAB_00ceba17;
      }
      pPVar11 = ParseNode::AsParseNodeBlock(pnodeScopeList);
      this->m_nextBlockId = pPVar11->blockId + 1;
      PushBlockInfo(this,pPVar11);
      this = (Parser *)scope;
      pSVar3 = pPVar11->scope;
      if ((pSVar3 == (Scope *)0x0) || (pSVar3 == pSVar2)) {
        FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                  ((Parser *)scope,pPVar11->pnodeScopes,fn);
      }
      else {
        PushScope((Parser *)scope,pSVar3);
        FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                  (this,pPVar11->pnodeScopes,fn);
        BindPidRefs<false>(this,*(BlockInfoStack **)&((Scope *)((long)this + 0xa20))->scopeType,
                           *(int *)((long)&((Scope *)((long)this + 0x90))->func + 4) - 1);
        PopScope(this,pSVar3);
      }
      PopBlockInfo(this);
      ppPVar19 = &pPVar11->pnodeNext;
    }
    pnodeScopeList = *ppPVar19;
  } while( true );
}

Assistant:

void Parser::FinishFunctionsInScope(ParseNodePtr pnodeScopeList, Fn fn)
{
    Scope * scope;
    Scope * origCurrentScope = this->m_currentScope;
    ParseNodePtr pnodeScope;
    ParseNodeBlock * pnodeBlock;
    for (pnodeScope = pnodeScopeList; pnodeScope;)
    {
        switch (pnodeScope->nop)
        {
        case knopBlock:
        {
            ParseNodeBlock * pnodeBlockScope = pnodeScope->AsParseNodeBlock();
            m_nextBlockId = pnodeBlockScope->blockId + 1;
            PushBlockInfo(pnodeBlockScope);
            scope = pnodeBlockScope->scope;
            if (scope && scope != origCurrentScope)
            {
                PushScope(scope);
            }
            FinishFunctionsInScope(pnodeBlockScope->pnodeScopes, fn);
            if (scope && scope != origCurrentScope)
            {
                BindPidRefs<false>(GetCurrentBlockInfo(), m_nextBlockId - 1);
                PopScope(scope);
            }
            PopBlockInfo();
            pnodeScope = pnodeBlockScope->pnodeNext;
            break;
        }
        case knopFncDecl:
            fn(pnodeScope->AsParseNodeFnc());
            pnodeScope = pnodeScope->AsParseNodeFnc()->pnodeNext;
            break;

        case knopCatch:
            scope = pnodeScope->AsParseNodeCatch()->scope;
            if (scope)
            {
                PushScope(scope);
            }
            pnodeBlock = CreateBlockNode(PnodeBlockType::Regular);
            pnodeBlock->scope = scope;
            PushBlockInfo(pnodeBlock);
            FinishFunctionsInScope(pnodeScope->AsParseNodeCatch()->pnodeScopes, fn);
            if (scope)
            {
                BindPidRefs<false>(GetCurrentBlockInfo(), m_nextBlockId - 1);
                PopScope(scope);
            }
            PopBlockInfo();
            pnodeScope = pnodeScope->AsParseNodeCatch()->pnodeNext;
            break;

        case knopWith:
            PushBlockInfo(CreateBlockNode());
            PushDynamicBlock();
            FinishFunctionsInScope(pnodeScope->AsParseNodeWith()->pnodeScopes, fn);
            PopBlockInfo();
            pnodeScope = pnodeScope->AsParseNodeWith()->pnodeNext;
            break;

        default:
            AssertMsg(false, "Unexpected node with scope list");
            return;
        }
    }
}